

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CTempExpression *expression)

{
  PrintVisitor *this_00;
  string local_78;
  string local_58;
  string local_38;
  
  this->lastVisited = this->lastVisited + 1;
  this_00 = (PrintVisitor *)CTempExpression::getTemprorary(expression);
  CTemp::ToString_abi_cxx11_(&local_58,(CTemp *)this_00);
  ConstructLabel(&local_38,this_00,&local_58,this->lastVisited);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  AddArrow(this,this->lastVisited);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Temp","");
  AddLabel(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CTempExpression &expression ) {
    ++lastVisited;
    description = ConstructLabel( expression.getTemprorary( ).ToString( ), lastVisited );
    AddArrow( lastVisited );
    AddLabel( "Temp" );
    ++lastVisited;
}